

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_194fe6::BuildFileImpl::parseDefaultTarget(BuildFileImpl *this,ScalarNode *entry)

{
  BuildFileDelegate *pBVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  StringRef local_a0;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  local_90;
  StringRef local_88;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
  local_78;
  undefined1 local_70 [8];
  string target;
  ScalarNode *entry_local;
  BuildFileImpl *this_local;
  
  target.field_2._8_8_ = entry;
  (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
            ((string *)local_70,this,entry);
  uVar3 = std::__cxx11::string::data();
  local_88.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_88.Length = uVar3;
  local_78.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                 ::find(&this->targets,local_88);
  local_90.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>,_llvm::MallocAllocator>
                 ::end(&this->targets);
  bVar2 = llvm::
          StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>_>
          ::operator==(&local_78,
                       (StringMapIterator<std::unique_ptr<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>_>_>
                        *)&local_90);
  uVar3 = target.field_2._8_8_;
  if (bVar2) {
    strlen("invalid default target, a default target should be in targets");
    error(this,(Node *)uVar3,local_a0);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->defaultTarget,(string *)local_70);
    pBVar1 = this->delegate;
    uVar3 = std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::length();
    (*pBVar1->_vptr_BuildFileDelegate[10])(pBVar1,uVar3,uVar4);
  }
  this_local._7_1_ = !bVar2;
  std::__cxx11::string::~string((string *)local_70);
  return this_local._7_1_;
}

Assistant:

bool parseDefaultTarget(llvm::yaml::ScalarNode* entry) {
    std::string target = stringFromScalarNode(entry);

    if (targets.find(target) == targets.end()) {
      error(entry, "invalid default target, a default target should be in targets");
      return false;
    }

    defaultTarget = target;
    delegate.loadedDefaultTarget(defaultTarget);

    return true;
  }